

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk * town_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  town *ptVar1;
  level_conflict *plVar2;
  loc to_avoid;
  bool bVar3;
  loc_conflict grid2;
  level_map_conflict *plVar4;
  _Bool _Var5;
  short sVar6;
  uint32_t uVar7;
  wchar_t wVar8;
  int iVar9;
  uint uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  char *pcVar19;
  chunk_conflict *source;
  chunk *c;
  square *psVar20;
  loc lVar21;
  level_conflict *plVar22;
  char *pcVar23;
  wchar_t *pwVar24;
  feature *pfVar25;
  short sVar26;
  loc_conflict lVar27;
  loc lVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  loc lVar31;
  ulong uVar32;
  long lVar33;
  uint32_t uVar34;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  loc grid_04;
  loc grid_05;
  int iVar35;
  wchar_t wVar36;
  loc grid_06;
  loc grid_07;
  loc grid_08;
  long lVar37;
  wchar_t wVar38;
  uint uVar39;
  loc lVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  undefined4 uVar44;
  undefined4 in_stack_fffffffffffffed4;
  int *in_stack_fffffffffffffed8;
  wchar_t local_120;
  level_conflict *local_118;
  loc local_110;
  loc_conflict door_1;
  loc local_f8;
  loc_conflict door;
  wchar_t local_e0;
  wchar_t lot_e;
  ulong local_d8;
  ulong local_d0;
  level_conflict *local_c8;
  ulong local_c0;
  loc local_b8;
  ulong local_b0;
  player *local_a8;
  ulong local_a0;
  level_conflict *local_98;
  level_conflict *local_90;
  ulong local_88;
  ulong local_80;
  loc local_78;
  wchar_t local_70;
  int local_6c;
  loc_conflict local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  uint local_48;
  int local_44;
  loc local_40;
  level_conflict *local_38;
  
  _Var5 = is_daytime();
  local_48 = (uint)(&z_info->town_monsters_day)[!_Var5];
  local_90 = world->levels + p->place;
  local_a8 = p;
  pcVar19 = level_name(local_90);
  source = chunk_find_name(pcVar19);
  uVar42 = (ulong)(uint)world->num_towns;
  if (world->num_towns < 1) {
    uVar42 = 0;
  }
  uVar32 = 0;
  do {
    uVar41 = uVar32;
    if (uVar42 * 0x28 + 0x28 == uVar41 + 0x28) {
      __assert_fail("i < world->num_towns",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                    ,0xb25,"struct chunk *town_gen(struct player *, int, int, const char **)");
    }
    ptVar1 = world->towns;
    uVar32 = uVar41 + 0x28;
  } while (*(int *)((long)&ptVar1->index + uVar41) != (int)local_a8->place);
  c = (chunk *)cave_new((uint)z_info->town_hgt,
                        (uint)(z_info->town_wid >>
                              (*(int *)((long)&ptVar1->num_stores + uVar41) < 5)));
  wVar38 = FEAT_MORE;
  if (source == (chunk_conflict *)0x0) {
    c->depth = (int)local_a8->depth;
    c->place = (int)local_a8->place;
    uVar34 = Rand_div(3);
    local_60 = (ulong)(uint)c->height;
    local_50 = (ulong)(uint)c->width;
    local_110.x = c->height + L'\xffffffff';
    local_110.y = L'\0';
    draw_rectangle(c,L'\0',L'\0',local_110.x,c->width + L'\xffffffff',FEAT_PERM,L'\0',true);
    local_44 = uVar34 + 6;
    local_38 = (level_conflict *)((long)&ptVar1->stores + uVar41);
    local_58 = 0;
    if (local_44 < 1) {
      local_44 = 0;
    }
    local_40.x = L'\x01';
    local_40.y = L'\x01';
    local_70 = L'\0';
    bVar43 = false;
    uVar42 = 0;
    local_b8 = local_110;
    local_78 = local_110;
LAB_00147521:
    if (!bVar43) {
      lVar33 = 1;
      lVar28 = local_40;
      while( true ) {
        wVar38 = c->height;
        uVar42 = (long)wVar38 - 1;
        if ((long)uVar42 <= lVar33) break;
        lVar31 = lVar28;
        for (lVar37 = 1; lVar37 < (long)c->width + -1; lVar37 = lVar37 + 1) {
          square_set_feat((chunk_conflict *)c,lVar31,FEAT_GRANITE);
          lVar31 = (loc)((long)lVar31 + 1);
        }
        lVar33 = lVar33 + 1;
        lVar28 = (loc)((long)lVar28 + 0x100000000);
      }
      iVar9 = strcmp(world->name,"Angband Dungeon");
      iVar18 = local_44;
      if (iVar9 == 0) {
        while (iVar18 != 0) {
          build_streamer(c,FEAT_LAVA,L'\0');
          iVar18 = iVar18 + -1;
        }
        uVar44 = 0;
        generate_starburst_room
                  (c,L'\x01',L'\x01',c->height + L'\xffffffff',c->width + L'\xffffffff',false,
                   FEAT_FLOOR,false);
      }
      else {
        uVar44 = 0;
        fill_ellipse(c,(wchar_t)((long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 |
                                       uVar42 & 0xffffffff) / 2),(c->width + L'\xffffffff') / 2,
                     (wVar38 + L'\xfffffffc') / 2,(c->width + L'\xfffffffa') / 2,FEAT_FLOOR,L'\0',
                     false);
      }
      lVar28.x = L'\x01';
      lVar28.y = L'\x01';
      for (lVar33 = 1; lVar33 < (long)c->height + -1; lVar33 = lVar33 + 1) {
        lVar31 = lVar28;
        for (lVar37 = 1; lVar37 < (long)c->width + -1; lVar37 = lVar37 + 1) {
          psVar20 = square((chunk_conflict *)c,lVar31);
          flag_off(psVar20->info,3,4);
          _Var5 = square_isperm((chunk_conflict *)c,lVar31);
          if (((!_Var5) && (_Var5 = square_isfiery((chunk_conflict *)c,lVar31), !_Var5)) &&
             (_Var5 = square_isfloor((chunk_conflict *)c,lVar31), !_Var5)) {
            square_set_feat((chunk_conflict *)c,lVar31,FEAT_PERM);
          }
          lVar31 = (loc)((long)lVar31 + 1);
        }
        lVar28 = (loc)((long)lVar28 + 0x100000000);
      }
      wVar38 = c->width;
      uVar34 = Rand_div(wVar38 / 2);
      lVar31.x = uVar34 + wVar38 / 4;
      lVar31.y = L'\0';
      wVar38 = c->height;
      uVar34 = Rand_div(wVar38 / 2);
      uVar39 = uVar34 + wVar38 / 4;
      local_80 = (ulong)uVar39;
      uVar42 = (long)(int)lVar31.x / -6;
      local_98 = (level_conflict *)CONCAT44(local_98._4_4_,(c->width - lVar31.x) / 6);
      local_6c = (int)uVar39 / -4;
      local_90 = (level_conflict *)CONCAT44(local_90._4_4_,(c->height - uVar39) / 4);
      local_68.y = uVar39;
      local_68.x = lVar31.x;
      iVar18 = 0;
      local_c8 = local_38;
      local_f8 = (loc)(uVar42 & 0xffffffff);
      local_b8 = lVar31;
      lVar28 = (loc)uVar42;
      while( true ) {
        uVar32 = (ulong)lVar28 & 0xffffffff;
        local_c8 = *(level_conflict **)local_c8;
        if (local_c8 == (level_conflict *)0x0) break;
        bVar43 = false;
        lVar40 = local_78;
        while (iVar18 < 100 && !bVar43) {
          uVar34 = Rand_div(2);
          if (uVar34 == 0) {
            uVar34 = Rand_div(2);
            uVar39 = -(uint)(uVar34 == 0) | 1;
            uVar10 = rand_range(local_6c,(int)local_90);
          }
          else {
            uVar39 = rand_range((int)uVar42,(wchar_t)local_98);
            uVar34 = Rand_div(2);
            uVar10 = -(uint)(uVar34 == 0) | 1;
          }
          local_110.y = L'\0';
          local_110.x = uVar10;
          lVar40.y = L'\0';
          lVar40.x = uVar39;
          iVar18 = iVar18 + 1;
          if ((uVar10 != 0) && (uVar39 != 0)) {
            lVar27.y = uVar10;
            lVar27.x = uVar39;
            local_78 = lVar40;
            get_lot_bounds(c,local_68,lVar27,(wchar_t)&door_1,(int)&door_1 + L'\x04',&door.x,&door.y
                           ,(int *)CONCAT44(in_stack_fffffffffffffed4,uVar44),
                           in_stack_fffffffffffffed8);
            iVar14 = door.y;
            iVar35 = door.x;
            iVar9 = door_1.y;
            if ((door.x - door_1.x < 5) || (wVar38 = door_1.x, door.y - door_1.y < 3)) {
LAB_00147909:
              bVar43 = false;
              lVar40 = local_78;
            }
            else {
              for (; wVar29 = iVar9, wVar38 <= iVar35; wVar38 = wVar38 + L'\x01') {
                while (wVar29 <= iVar14) {
                  grid.y = wVar29;
                  grid.x = wVar38;
                  _Var5 = square_isfloor((chunk_conflict *)c,grid);
                  wVar29 = wVar29 + L'\x01';
                  if (!_Var5) goto LAB_00147909;
                }
              }
              bVar43 = true;
              lVar40 = local_78;
            }
          }
        }
        local_78 = lVar40;
        if (99 < iVar18) {
          bVar43 = false;
          uVar42 = local_80;
          goto LAB_00147521;
        }
        wVar38 = local_110.x;
        wVar29 = (int)local_80 + wVar38 * 4;
        wVar8 = (wchar_t)local_60;
        local_60 = local_60 & 0xffffffff;
        if (wVar29 <= wVar8) {
          local_60 = (ulong)(uint)wVar29;
        }
        if (local_70 <= wVar29) {
          local_70 = wVar29;
        }
        wVar29 = lVar40.x;
        uVar39 = wVar29 * 6 + local_b8.x;
        iVar9 = (int)local_50;
        local_50 = local_50 & 0xffffffff;
        if ((int)uVar39 <= iVar9) {
          local_50 = (ulong)uVar39;
        }
        iVar9 = (int)local_58;
        local_58 = local_58 & 0xffffffff;
        if (iVar9 <= (int)uVar39) {
          local_58 = (ulong)uVar39;
        }
        get_lot_bounds(c,local_68,
                       (loc_conflict)((ulong)lVar40 & 0xffffffff | (long)local_110 << 0x20),
                       (wchar_t)&door_1,(wchar_t)&door,&lot_e,&local_e0,
                       (int *)CONCAT44(in_stack_fffffffffffffed4,uVar44),in_stack_fffffffffffffed8);
        wVar8 = lot_e;
        wVar36 = local_e0;
        iVar9 = door.x;
        wVar13 = door_1.x;
        if ((uint)(wVar29 + L'\xfffffffe') < 0xfffffffd) {
          if (wVar38 == L'\xffffffff') {
            local_88 = (ulong)(uint)door.x;
            wVar29 = door.x + L'\x01';
            uVar32 = (ulong)(uint)local_e0;
            uVar34 = Rand_div(2);
            local_b0 = uVar32;
            if (wVar29 < wVar36 - uVar34) {
              uVar34 = Rand_div(2);
              wVar29 = (int)local_b0 - uVar34;
            }
            wVar11 = wVar29 + L'\xfffffffe';
            wVar36 = wVar29;
          }
          else {
            local_b0 = (ulong)(uint)local_e0;
            wVar29 = local_e0 + L'\xffffffff';
            uVar32 = (ulong)(uint)door.x;
            uVar34 = Rand_div(2);
            if ((int)(uVar34 + iVar9) < wVar29) {
              uVar34 = Rand_div(2);
              wVar29 = uVar34 + iVar9;
            }
            local_88 = uVar32;
            wVar11 = wVar29;
            wVar36 = wVar29 + L'\x02';
          }
          wVar38 = lot_e;
          local_120 = door_1.x;
          wVar8 = rand_range(door_1.x + 1,lot_e + L'\xfffffffe');
          iVar9 = wVar8 + L'\xfffffffe';
          if (wVar8 + L'\xfffffffe' < local_120) {
            iVar9 = local_120;
          }
          wVar12 = rand_range(iVar9,wVar8);
          lVar28 = (loc)loc(wVar12 + L'\xffffffff',wVar29);
          _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
          wVar30 = wVar12 + L'\x01';
          wVar13 = wVar30;
          if (wVar30 < wVar8) {
            wVar13 = wVar8;
          }
          if (_Var5) {
            wVar13 = wVar8;
            wVar30 = wVar12;
          }
          local_d8 = (ulong)(uint)wVar13;
          wVar8 = wVar13 + L'\x02';
          if (wVar38 <= wVar13 + L'\x02') {
            wVar8 = wVar38;
          }
          wVar13 = rand_range(wVar30 + L'\x02',wVar8);
          iVar9 = wVar13 - wVar30;
joined_r0x001480fb:
          if (1 < iVar9) {
            lVar28 = (loc)loc(wVar13 + L'\x01',wVar29);
            _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
            if (!_Var5) {
              wVar13 = wVar13 + L'\xffffffff';
              wVar8 = (wchar_t)local_d8;
              local_d8 = local_d8 & 0xffffffff;
              if (wVar13 <= wVar8) {
                local_d8 = (ulong)(uint)wVar13;
              }
            }
          }
        }
        else if ((uint)(wVar38 + L'\xfffffffe') < 0xfffffffd) {
          if (wVar29 == L'\xffffffff') {
            uVar39 = door_1.x + 1;
            local_a0 = (ulong)(uint)lot_e;
            uVar34 = Rand_div(2);
            uVar7 = Rand_div(2);
            iVar9 = (int)local_a0;
            if ((int)uVar39 < (int)(iVar9 - (uVar7 + uVar34))) {
              uVar34 = Rand_div(2);
              uVar7 = Rand_div(2);
              uVar39 = iVar9 - (uVar7 + uVar34);
            }
            uVar32 = (ulong)uVar39;
            local_d0 = (ulong)(uVar39 - 2);
            local_c0 = uVar32;
          }
          else {
            local_a0 = (ulong)(uint)lot_e;
            local_d0 = (ulong)(uint)(lot_e + L'\xffffffff');
            uVar34 = Rand_div(2);
            uVar7 = Rand_div(2);
            if (uVar7 + uVar34 + wVar13 < (int)local_d0) {
              uVar34 = Rand_div(2);
              uVar7 = Rand_div(2);
              local_d0 = (ulong)(uint)(uVar7 + uVar34 + wVar13);
            }
            uVar32 = local_d0 & 0xffffffff;
            local_c0 = (ulong)((int)local_d0 + 2);
          }
          iVar9 = door.x;
          local_120 = wVar13;
          local_120 = wVar13;
          uVar41 = (ulong)(uint)door.x;
          local_b0 = (ulong)(uint)local_e0;
          local_d8 = uVar32;
          wVar38 = rand_range(door.x,local_e0 + L'\xffffffff');
          iVar35 = wVar38 + L'\xfffffffe';
          if (wVar38 + L'\xfffffffe' < iVar9) {
            iVar35 = iVar9;
          }
          local_88 = uVar41;
          wVar8 = rand_range(iVar35,wVar38);
          lVar28 = (loc)loc((int)uVar32,wVar8 + L'\xffffffff');
          _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
          wVar11 = wVar8 + L'\x01';
          wVar29 = wVar11;
          if (wVar11 < wVar38) {
            wVar29 = wVar38;
          }
          if (_Var5) {
            wVar29 = wVar38;
            wVar11 = wVar8;
          }
          wVar38 = wVar11 + L'\x01';
          if (wVar11 + L'\x01' <= wVar29) {
            wVar38 = wVar29;
          }
          iVar9 = wVar29 + L'\x02';
          if ((int)local_b0 < wVar29 + L'\x02') {
            iVar9 = (int)local_b0;
          }
          wVar36 = rand_range(wVar38,iVar9);
          if (wVar36 - wVar11 < 2) {
            wVar38 = (wchar_t)local_a0;
            wVar30 = (wchar_t)local_d0;
            wVar13 = (wchar_t)local_c0;
          }
          else {
            lVar28 = (loc)loc((int)local_d8,wVar36 + L'\x01');
            _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
            wVar38 = (wchar_t)local_a0;
            if ((!_Var5) && (wVar36 = wVar36 + L'\xffffffff', wVar36 <= wVar29)) {
              wVar29 = wVar36;
            }
            wVar30 = (wchar_t)local_d0;
            wVar13 = (wchar_t)local_c0;
          }
        }
        else {
          if (wVar29 < L'\0') {
            uVar32 = (ulong)(uint)lot_e;
            uVar34 = Rand_div(2);
            wVar38 = ~uVar34 + wVar8;
            uVar34 = Rand_div(2);
            if (uVar34 + wVar38 < wVar8) {
              uVar34 = Rand_div(2);
              wVar8 = uVar34 + wVar38;
            }
            local_120 = door_1.x;
            iVar9 = wVar38 + L'\xfffffffe';
            if (wVar38 + L'\xfffffffe' < door_1.x) {
              iVar9 = door_1.x;
            }
            local_a0 = uVar32;
            wVar13 = rand_range(iVar9,wVar8 + L'\xfffffffe');
          }
          else {
            local_120 = door_1.x;
            uVar34 = Rand_div(2);
            iVar9 = wVar13 + uVar34;
            wVar38 = iVar9 + L'\x01';
            uVar34 = Rand_div(2);
            if (wVar13 < wVar38 - uVar34) {
              uVar34 = Rand_div(2);
              wVar13 = wVar38 - uVar34;
            }
            local_a0 = (ulong)(uint)lot_e;
            wVar29 = iVar9 + L'\x03';
            if (lot_e < wVar29) {
              wVar29 = lot_e;
            }
            wVar8 = rand_range(wVar13 + L'\x02',wVar29);
          }
          wVar29 = local_e0;
          iVar9 = door.x;
          local_d0 = (ulong)(uint)wVar13;
          local_d8 = (ulong)(uint)wVar38;
          local_c0 = (ulong)(uint)wVar8;
          if ((long)local_110 << 0x20 < 0) {
            uVar32 = (ulong)(uint)local_e0;
            uVar34 = Rand_div(2);
            wVar29 = wVar29 - uVar34;
            local_b0 = uVar32;
            wVar36 = wVar29;
            if (wVar13 == wVar38 || wVar8 == wVar38) {
              uVar34 = Rand_div(2);
              wVar36 = uVar34 + wVar29;
            }
            local_88 = (ulong)(uint)door.x;
            wVar11 = wVar29 + L'\xfffffffe';
            if (wVar29 + L'\xfffffffe' < door.x) {
              wVar11 = door.x;
            }
            wVar8 = local_78.x;
            wVar38 = (wchar_t)local_a0;
            if (wVar36 - wVar11 < 2) goto LAB_00147f8a;
            lVar28 = (loc)loc((int)local_d8,wVar11 + L'\xffffffff');
            _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
            wVar13 = (wchar_t)local_c0;
            if ((!_Var5) && (wVar11 = wVar11 + L'\x01', wVar29 < wVar11)) {
              wVar29 = wVar11;
            }
          }
          else {
            uVar32 = (ulong)(uint)door.x;
            uVar34 = Rand_div(2);
            wVar29 = uVar34 + iVar9;
            wVar11 = wVar29;
            local_88 = uVar32;
            if (wVar13 == wVar38 || wVar8 == wVar38) {
              uVar34 = Rand_div(2);
              wVar11 = wVar29 - uVar34;
            }
            local_b0 = (ulong)(uint)local_e0;
            wVar36 = wVar29 + L'\x02';
            if (local_e0 < wVar29 + L'\x02') {
              wVar36 = local_e0;
            }
            wVar8 = local_78.x;
            wVar38 = (wchar_t)local_a0;
            if (wVar36 - wVar11 < 2) {
LAB_00147f8a:
              wVar13 = (wchar_t)local_c0;
            }
            else {
              lVar28 = (loc)loc((int)local_d8,wVar36 + L'\x01');
              _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
              wVar13 = (wchar_t)local_c0;
              if ((!_Var5) && (wVar36 = wVar36 + L'\xffffffff', wVar36 < wVar29)) {
                wVar29 = wVar36;
              }
              wVar8 = local_78.x;
            }
          }
          wVar30 = (wchar_t)local_d0;
          iVar9 = wVar13 - (wchar_t)local_d0;
          if ((wVar8 < L'\0') && (1 < iVar9)) {
            lVar28 = (loc)loc((wchar_t)local_d0 + L'\xffffffff',wVar29);
            _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
            if (!_Var5) {
              wVar30 = wVar30 + L'\x01';
              wVar8 = (wchar_t)local_d8;
              local_d8 = local_d8 & 0xffffffff;
              if (wVar8 <= wVar30) {
                local_d8 = (ulong)(uint)wVar30;
              }
            }
          }
          else if (L'\0' < wVar8) goto joined_r0x001480fb;
        }
        if (local_120 < wVar30) {
          local_120 = wVar30;
        }
        if (wVar13 < wVar38) {
          wVar38 = wVar13;
        }
        wVar8 = (wchar_t)local_88;
        if ((wchar_t)local_88 < wVar11) {
          wVar8 = wVar11;
        }
        wVar13 = (wchar_t)local_b0;
        if (wVar36 < (wchar_t)local_b0) {
          wVar13 = wVar36;
        }
        fill_rectangle(c,wVar8,local_120,wVar13,wVar38,FEAT_PERM,L'\0');
        uVar32 = local_d8 & 0xffffffff;
        lVar33 = 0x29;
        for (uVar41 = 0; lVar28 = local_f8, uVar41 < z_info->f_max; uVar41 = uVar41 + 1) {
          _Var5 = feat_is_shop((wchar_t)uVar41);
          if ((_Var5) && (*(int *)&local_c8->north + 1U == (uint)f_info->flags[lVar33 + -0x2b])) {
            square_set_feat((chunk_conflict *)c,(loc)(uVar32 | (ulong)(uint)wVar29 << 0x20),
                            (wchar_t)uVar41);
          }
          lVar33 = lVar33 + 0x78;
        }
      }
      bVar43 = false;
      uVar42 = local_80;
      if (iVar18 < 100) {
        while( true ) {
          iVar18 = (int)uVar32;
          if ((wchar_t)local_98 < iVar18) break;
          iVar9 = local_6c;
          if (iVar18 != 0) {
            for (; iVar9 <= (int)local_90; iVar9 = iVar9 + 1) {
              if (((iVar9 != 0) && (uVar34 = Rand_div(100), (int)uVar34 < 0x51)) &&
                 (uVar34 = Rand_div(2), uVar34 == 0)) {
                lVar27 = loc(iVar18,iVar9);
                get_lot_bounds(c,local_68,lVar27,(wchar_t)&door_1,(int)&door_1 + L'\x04',&door.x,
                               &door.y,(int *)CONCAT44(in_stack_fffffffffffffed4,uVar44),
                               in_stack_fffffffffffffed8);
                iVar14 = door.y;
                iVar35 = door.x;
                local_c8 = (level_conflict *)CONCAT44(local_c8._4_4_,door_1.y);
                wVar38 = door_1.y;
                for (wVar29 = door_1.x; wVar29 <= iVar35; wVar29 = wVar29 + L'\x01') {
                  while (wVar38 <= iVar14) {
                    grid_00.y = wVar38;
                    grid_00.x = wVar29;
                    psVar20 = square((chunk_conflict *)c,grid_00);
                    _Var5 = feat_is_shop((uint)psVar20->feat);
                    wVar38 = wVar38 + L'\x01';
                    uVar42 = local_80;
                    if (_Var5) goto LAB_00148236;
                  }
                  wVar38 = (wchar_t)local_c8;
                }
                lVar27 = loc(iVar18,iVar9);
                get_lot_bounds(c,local_68,lVar27,(wchar_t)&door_1,(wchar_t)&door,&lot_e,&local_e0,
                               (int *)CONCAT44(in_stack_fffffffffffffed4,uVar44),
                               in_stack_fffffffffffffed8);
                iVar35 = door_1.x;
                local_b0 = CONCAT44(local_b0._4_4_,lot_e);
                uVar42 = local_80;
                if (door_1.x < lot_e) {
                  local_c8 = (level_conflict *)CONCAT44(local_c8._4_4_,local_e0);
                  local_88 = CONCAT44(local_88._4_4_,door.x);
                  if (door.x < local_e0) {
                    iVar14 = rand_range(1,4);
                    iVar15 = rand_range(1,2);
                    iVar16 = rand_range(1,5 - iVar14);
                    iVar17 = rand_range(1,3 - iVar15);
                    wVar38 = iVar17 + iVar15 + (wchar_t)local_c8 + L'\xfffffffc';
                    wVar8 = iVar17 + (wchar_t)local_88;
                    wVar29 = iVar16 + iVar14 + (int)local_b0 + L'\xfffffffa';
                    local_a0 = CONCAT44(local_a0._4_4_,iVar16 + iVar35);
                    local_c0 = CONCAT44(local_c0._4_4_,wVar29);
                    fill_rectangle(c,wVar8,iVar16 + iVar35,wVar38,wVar29,FEAT_GRANITE,L'\0');
                    iVar14 = iVar35;
                    while (iVar15 = iVar14, uVar42 = local_80, iVar15 <= (int)local_b0) {
                      bVar43 = iVar15 < (int)local_a0;
                      bVar3 = (int)local_c0 < iVar15;
                      local_d8 = CONCAT71(local_d8._1_7_,iVar15 == 2 || iVar35 < iVar15);
                      local_d0 = CONCAT44(local_d0._4_4_,iVar15 + -1);
                      for (wVar29 = (wchar_t)local_88; iVar14 = iVar15 + 1,
                          wVar29 <= (wchar_t)local_c8; wVar29 = wVar29 + L'\x01') {
                        if ((wVar38 < wVar29) || (wVar29 < wVar8 || (bVar3 || bVar43))) {
                          uVar34 = Rand_div(3);
                          if (uVar34 == 0) {
                            lVar28 = (loc)loc(iVar15,wVar29);
                            _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
                            if (_Var5) {
                              if ((char)local_d8 == '\0') {
                                lVar28 = (loc)loc((wchar_t)local_d0,wVar29);
                                _Var5 = square_isperm((chunk_conflict *)c,lVar28);
                                if (_Var5) goto LAB_001484fd;
                              }
                              if (((int)local_b0 <= iVar15) && (iVar15 != c->width + L'\xfffffffe'))
                              {
                                lVar28 = (loc)loc(iVar15 + 1,wVar29);
                                _Var5 = square_isperm((chunk_conflict *)c,lVar28);
                                if (_Var5) goto LAB_001484fd;
                              }
                              if (wVar29 != L'\x02' && wVar29 <= (wchar_t)local_88) {
                                lVar28 = (loc)loc(iVar15,wVar29 + L'\xffffffff');
                                _Var5 = square_isperm((chunk_conflict *)c,lVar28);
                                if (_Var5) goto LAB_001484fd;
                              }
                              pwVar24 = &FEAT_PASS_RUBBLE;
                              if (((wchar_t)local_c8 <= wVar29) &&
                                 (pwVar24 = &FEAT_PASS_RUBBLE, wVar29 != c->height + L'\xfffffffe'))
                              {
                                lVar28 = (loc)loc(iVar15,wVar29 + L'\x01');
                                _Var5 = square_isperm((chunk_conflict *)c,lVar28);
                                pwVar24 = &FEAT_PASS_RUBBLE;
                                if (_Var5) goto LAB_001484fd;
                              }
LAB_001483c8:
                              lVar28 = (loc)loc(iVar15,wVar29);
                              square_set_feat((chunk_conflict *)c,lVar28,*pwVar24);
                            }
                          }
                        }
                        else {
                          uVar34 = Rand_div(4);
                          pwVar24 = &FEAT_RUBBLE;
                          if (uVar34 == 0) goto LAB_001483c8;
                        }
LAB_001484fd:
                      }
                    }
                  }
                }
              }
LAB_00148236:
            }
          }
          uVar32 = (ulong)(iVar18 + 1);
        }
        bVar43 = true;
      }
      goto LAB_00147521;
    }
    fill_rectangle(c,(wchar_t)local_60,local_b8.x,local_70,local_b8.x + L'\x01',FEAT_FLOOR,L'\0');
    fill_rectangle(c,(wchar_t)uVar42,(wchar_t)local_50,(wchar_t)uVar42 + L'\x01',(wchar_t)local_58,
                   FEAT_FLOOR,L'\0');
    lVar21 = (loc)loc(0,0);
    local_f8 = (loc)loc(0,0);
    plVar4 = world;
    local_110 = (loc)((ulong)local_f8 >> 0x20);
    pcVar19 = strstr(world->name,"Wilderness");
    if (pcVar19 == (char *)0x0) {
      do {
        wVar38 = c->width;
        uVar34 = Rand_div((wVar38 / 0xc) * 2 + 1);
        grid_07.x = c->width / -0xc + wVar38 / 2 + uVar34;
        grid_07.y = L'\0';
        uVar42 = 0;
        local_b8 = grid_07;
        while( true ) {
          _Var5 = square_isfloor((chunk_conflict *)c,grid_07);
          iVar18 = c->height / 2;
          if ((_Var5) || ((long)iVar18 <= (long)uVar42)) break;
          uVar42 = uVar42 + 1;
          grid_07 = (loc)((long)grid_07 + 0x100000000);
        }
      } while (iVar18 <= (int)uVar42);
      square_set_feat((chunk_conflict *)c,grid_07,FEAT_MORE);
    }
    else {
      plVar2 = plVar4->levels;
      sVar6 = local_a8->place;
      sVar26 = local_a8->last_place;
      local_90 = plVar2;
      local_80 = uVar42;
      if (plVar2[sVar6].north == (char *)0x0) {
        plVar22 = (level_conflict *)0x0;
      }
      else {
        plVar22 = level_by_name(plVar4,plVar2[sVar6].north);
      }
      if (plVar2[sVar6].east == (char *)0x0) {
        local_118 = (level_conflict *)0x0;
      }
      else {
        local_118 = level_by_name(world,plVar2[sVar6].east);
      }
      if (plVar2[sVar6].south == (char *)0x0) {
        local_98 = (level_conflict *)0x0;
      }
      else {
        local_98 = level_by_name(world,plVar2[sVar6].south);
      }
      wVar38 = local_b8.x;
      lVar28 = (loc)((ulong)local_b8 & 0xffffffff);
      if (plVar2[sVar6].west == (char *)0x0) {
        local_c8 = (level_conflict *)0x0;
      }
      else {
        local_c8 = level_by_name(world,plVar2[sVar6].west);
      }
      local_90 = local_90 + sVar26;
      if (plVar22 == (level_conflict *)0x0) {
        uVar42 = (ulong)lVar21 >> 0x20;
      }
      else {
        uVar42 = 0;
        do {
          lVar28 = (loc)((long)lVar28 + 0x100000000);
          _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
          uVar42 = (ulong)((int)uVar42 + 1);
        } while (!_Var5);
        square_set_feat((chunk_conflict *)c,lVar28,FEAT_MORE_NORTH);
        if (plVar22 == local_90) {
          local_f8 = local_b8;
          local_110 = (loc)uVar42;
        }
        local_f8 = (loc)((ulong)local_f8 & 0xffffffff);
        lVar21 = local_b8;
      }
      lVar28 = (loc)(local_80 << 0x20);
      if (local_118 != (level_conflict *)0x0) {
        lVar21.y = L'\0';
        lVar21.x = c->width;
        do {
          lVar21.x = lVar21.x + L'\xffffffff';
          lVar21.y = L'\0';
          _Var5 = square_isfloor((chunk_conflict *)c,(loc)((ulong)lVar28 | (ulong)lVar21));
        } while (!_Var5);
        square_set_feat((chunk_conflict *)c,(loc)((ulong)lVar28 | (ulong)lVar21),FEAT_MORE_EAST);
        if (local_118 == local_90) {
          local_110 = (loc)local_80;
        }
        local_110 = (loc)((ulong)local_110 & 0xffffffff);
        uVar42 = local_80;
        local_f8 = (loc)((ulong)local_f8 & 0xffffffff);
        if (local_118 == local_90) {
          local_f8 = lVar21;
        }
      }
      if (local_98 != (level_conflict *)0x0) {
        uVar42 = (ulong)(uint)c->height;
        do {
          wVar29 = (int)uVar42 + L'\xffffffff';
          uVar42 = (ulong)(uint)wVar29;
          grid_08.y = wVar29;
          grid_08.x = wVar38;
          _Var5 = square_isfloor((chunk_conflict *)c,grid_08);
        } while (!_Var5);
        square_set_feat((chunk_conflict *)c,grid_08,FEAT_MORE_SOUTH);
        if (local_98 == local_90) {
          local_110 = (loc)(ulong)(uint)wVar29;
          local_f8 = local_b8;
        }
        local_f8 = (loc)((ulong)local_f8 & 0xffffffff);
        lVar21 = local_b8;
      }
      local_b8 = lVar21;
      plVar2 = local_c8;
      if (local_c8 != (level_conflict *)0x0) {
        do {
          lVar28 = (loc)((long)lVar28 + 1);
          _Var5 = square_isfloor((chunk_conflict *)c,lVar28);
        } while (!_Var5);
        square_set_feat((chunk_conflict *)c,lVar28,FEAT_MORE_WEST);
        if (plVar2 == local_90) {
          local_110 = (loc)local_80;
        }
        local_110 = (loc)((ulong)local_110 & 0xffffffff);
        if (plVar2 == local_90) {
          local_f8 = lVar28;
        }
        local_f8 = (loc)((ulong)local_f8 & 0xffffffff);
        uVar42 = local_80;
        local_b8 = lVar28;
      }
    }
    if ((local_f8.x == L'\0') || (SUB84(local_110,0) == 0)) {
      if (local_b8.x == L'\0') {
LAB_00148cda:
        __assert_fail("grid.x && grid.y",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                      ,0x9f9,
                      "struct loc place_town_stairs(struct chunk *, struct player *, struct loc)");
      }
      local_f8 = (loc)((ulong)local_b8 & 0xffffffff);
      local_110 = (loc)(uVar42 & 0xffffffff);
      if ((int)uVar42 == 0) goto LAB_00148cda;
    }
    for (iVar18 = local_f8.x + L'\xffffffff'; iVar9 = SUB84(local_110,0) + -1,
        iVar18 <= local_f8.x + L'\x01'; iVar18 = iVar18 + 1) {
      for (; iVar9 <= SUB84(local_110,0) + 1; iVar9 = iVar9 + 1) {
        lVar28 = (loc)loc(iVar18,iVar9);
        _Var5 = square_isfiery((chunk_conflict *)c,lVar28);
        if (_Var5) {
          lVar28 = (loc)loc(iVar18,iVar9);
          square_set_feat((chunk_conflict *)c,lVar28,FEAT_GRANITE);
        }
      }
    }
    lVar28 = (loc)((long)local_110 << 0x20 | (ulong)local_f8 & 0xffffffff);
    goto LAB_00148c54;
  }
  c->depth = source->depth;
  c->place = (int)local_a8->place;
  _Var5 = chunk_copy((chunk_conflict *)c,local_a8,source,L'\0',L'\0',L'\0',false);
  if (!_Var5) {
    quit_fmt("chunk_copy() level bounds failed!");
  }
  chunk_list_remove(pcVar19);
  cave_free(source);
  sVar6 = local_a8->home;
  sVar26 = local_a8->place;
  if (sVar26 == sVar6) {
    _Var5 = find_home(c,&door);
    if (!_Var5) {
      local_98 = (level_conflict *)CONCAT44(local_98._4_4_,wVar38);
      _Var5 = cave_find((chunk_conflict *)c,&door_1,square_isinemptysquare);
      if (!_Var5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                      ,0xaf4,"void build_new_house(struct chunk *)");
      }
      uVar34 = 8;
      bVar43 = false;
      for (wVar38 = door_1.y + L'\xffffffff'; wVar38 <= door_1.y + L'\x01';
          wVar38 = wVar38 + L'\x01') {
        for (wVar29 = door_1.x + L'\xffffffff'; wVar29 <= door_1.x + L'\x01';
            wVar29 = wVar29 + L'\x01') {
          grid_06.y = wVar38;
          grid_06.x = wVar29;
          grid2.y = door_1.y;
          grid2.x = door_1.x;
          _Var5 = loc_eq((loc_conflict)grid_06,grid2);
          if (_Var5) {
            square_set_feat((chunk_conflict *)c,grid_06,FEAT_PERM);
          }
          else {
            wVar8 = FEAT_PERM;
            if ((!bVar43) && (uVar7 = Rand_div(uVar34), wVar8 = FEAT_PERM, uVar7 == 0)) {
              wVar8 = lookup_feat("Home");
              bVar43 = true;
            }
            square_set_feat((chunk_conflict *)c,grid_06,wVar8);
            uVar34 = uVar34 - 1;
          }
        }
      }
      wVar38 = (wchar_t)local_98;
    }
    sVar6 = local_a8->home;
    sVar26 = local_a8->place;
  }
  if (sVar26 != sVar6) {
    local_98 = (level_conflict *)CONCAT44(local_98._4_4_,wVar38);
    _Var5 = find_home(c,&door_1);
    wVar38 = door_1.x;
    if (_Var5) {
      do {
        wVar29 = wVar38;
        grid_01.y = door_1.y;
        grid_01.x = wVar29;
        _Var5 = square_ispermanent((chunk_conflict *)c,grid_01);
        wVar38 = wVar29 + L'\xffffffff';
      } while (_Var5);
      wVar38 = door_1.y;
      do {
        wVar8 = wVar38;
        grid_02.y = wVar8;
        grid_02.x = wVar29 + L'\x01';
        _Var5 = square_ispermanent((chunk_conflict *)c,grid_02);
        wVar38 = wVar8 + L'\xffffffff';
      } while (_Var5);
      do {
        wVar38 = door_1.x;
        grid_03.y = door_1.y;
        grid_03.x = wVar38;
        _Var5 = square_ispermanent((chunk_conflict *)c,grid_03);
        door_1.x = wVar38 + L'\x01';
      } while (_Var5);
      do {
        wVar13 = door_1.y;
        grid_04.y = wVar13;
        grid_04.x = wVar38 + L'\xffffffff';
        _Var5 = square_ispermanent((chunk_conflict *)c,grid_04);
        door_1.y = wVar13 + L'\x01';
      } while (_Var5);
      while (wVar8 < wVar13 + L'\xffffffff') {
        wVar8 = wVar8 + L'\x01';
        for (wVar36 = wVar29 + L'\x01'; wVar36 < wVar38; wVar36 = wVar36 + L'\x01') {
          grid_05.y = wVar8;
          grid_05.x = wVar36;
          square_set_feat((chunk_conflict *)c,grid_05,FEAT_FLOOR);
        }
      }
    }
    wVar38 = (wchar_t)local_98;
  }
  plVar4 = world;
  pcVar19 = strstr(world->name,"Wilderness");
  plVar2 = local_90;
  if (pcVar19 != (char *)0x0) {
    plVar22 = plVar4->levels + local_a8->last_place;
    pcVar19 = local_90->north;
    if (pcVar19 == (char *)0x0) {
LAB_0014879c:
      pcVar19 = plVar2->east;
      if (pcVar19 != (char *)0x0) {
        pcVar23 = level_name(plVar22);
        iVar18 = strcmp(pcVar19,pcVar23);
        if (iVar18 == 0) {
          pwVar24 = &FEAT_MORE_EAST;
          goto LAB_00148bb8;
        }
      }
      pcVar19 = plVar2->south;
      if (pcVar19 != (char *)0x0) {
        pcVar23 = level_name(plVar22);
        iVar18 = strcmp(pcVar19,pcVar23);
        if (iVar18 == 0) {
          pwVar24 = &FEAT_MORE_SOUTH;
          goto LAB_00148bb8;
        }
      }
      pcVar19 = plVar2->west;
      if (pcVar19 != (char *)0x0) {
        pcVar23 = level_name(plVar22);
        iVar18 = strcmp(pcVar19,pcVar23);
        if (iVar18 == 0) {
          pwVar24 = &FEAT_MORE_WEST;
          goto LAB_00148bb8;
        }
      }
    }
    else {
      pcVar23 = level_name(plVar22);
      iVar18 = strcmp(pcVar19,pcVar23);
      if (iVar18 != 0) goto LAB_0014879c;
      pwVar24 = &FEAT_MORE_NORTH;
LAB_00148bb8:
      wVar38 = *pwVar24;
    }
    if (wVar38 == FEAT_MORE) {
      if (plVar2->north == (char *)0x0) {
        if (plVar2->east == (char *)0x0) {
          if (plVar2->south == (char *)0x0) {
            if (plVar2->west == (char *)0x0) goto LAB_00148c05;
            pwVar24 = &FEAT_MORE_WEST;
          }
          else {
            pwVar24 = &FEAT_MORE_SOUTH;
          }
        }
        else {
          pwVar24 = &FEAT_MORE_EAST;
        }
      }
      else {
        pwVar24 = &FEAT_MORE_NORTH;
      }
      wVar38 = *pwVar24;
    }
  }
LAB_00148c05:
  lVar37 = 0;
  uVar42 = 0;
  for (lVar33 = 0; lVar33 < c->height; lVar33 = lVar33 + 1) {
    for (uVar42 = 0; (long)uVar42 < (long)c->width; uVar42 = uVar42 + 1) {
      pfVar25 = square_feat((chunk_conflict *)c,(loc)(lVar37 + uVar42));
      if (pfVar25->fidx == wVar38) goto LAB_00148c4a;
    }
    lVar37 = lVar37 + 0x100000000;
  }
LAB_00148c4a:
  lVar28 = (loc)(uVar42 & 0xffffffff | lVar33 << 0x20);
LAB_00148c54:
  player_place((chunk_conflict2 *)c,local_a8,lVar28);
  _Var5 = is_daytime();
  cave_illuminate(c,_Var5);
  uVar39 = local_48;
  while (bVar43 = uVar39 != 0, uVar39 = uVar39 - 1, bVar43) {
    to_avoid.x = (local_a8->grid).x;
    to_avoid.y = (local_a8->grid).y;
    pick_and_place_distant_monster(c,to_avoid,L'\x03',true,c->depth);
  }
  return c;
}

Assistant:

struct chunk *town_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i;
	struct loc grid;
	int residents = is_daytime() ? z_info->town_monsters_day :
		z_info->town_monsters_night;
	struct level *lev = &world->levels[p->place];
	char *name = level_name(lev);
	struct chunk *c_new, *c_old = chunk_find_name(name);
	struct town *town = NULL;

	/* Find the town */
	for (i = 0; i < world->num_towns; i++) {
		town = &world->towns[i];
		if (town->index == p->place) break;
	}
	assert (i < world->num_towns);

	/* Make a new chunk */
	c_new = cave_new(z_info->town_hgt, town->num_stores > 4 ?
					 z_info->town_wid : z_info->town_wid / 2);

	/* First time */
	if (!c_old) {
		c_new->depth = p->depth;
		c_new->place = p->place;

		/* Build stuff */
		town_gen_layout(c_new, p, town);
	} else {
		int feat = FEAT_MORE;

		/* Copy from the chunk list, remove the old one */
		c_new->depth = c_old->depth;
		c_new->place = p->place;
		if (!chunk_copy(c_new, p, c_old, 0, 0, 0, 0))
			quit_fmt("chunk_copy() level bounds failed!");
		chunk_list_remove(name);
		cave_free(c_old);

		/* Build a new house if needed */
		if (p->place == p->home) {
			struct loc door;
			if (!find_home(c_new, &door)) {
				build_new_house(c_new);
			}
		}

		/* Demolish an old house if needed */
		if (p->place != p->home) {
			struct loc door;
			if (find_home(c_new, &door)) {
				demolish_house(c_new, door);
			}
		}

		/* Get the correct path for wilderness */
		if (strstr(world->name, "Wilderness")) {
			struct level *last_lev = &world->levels[p->last_place];
			if (lev->north && streq(lev->north, level_name(last_lev))) {
				feat = FEAT_MORE_NORTH;
			} else if (lev->east && streq(lev->east, level_name(last_lev))) {
				feat = FEAT_MORE_EAST;
			} else if (lev->south && streq(lev->south, level_name(last_lev))) {
				feat = FEAT_MORE_SOUTH;
			} else if (lev->west && streq(lev->west, level_name(last_lev))) {
				feat = FEAT_MORE_WEST;
			}

			/* Deal with recall */
			if (feat == FEAT_MORE) {
				if (lev->north) {
				feat = FEAT_MORE_NORTH;
				} else if (lev->east) {
					feat = FEAT_MORE_EAST;
				} else if (lev->south) {
					feat = FEAT_MORE_SOUTH;
				} else if (lev->west) {
					feat = FEAT_MORE_WEST;
				}
			}
		}

		/* Find the required stair/path */
		for (grid.y = 0; grid.y < c_new->height; grid.y++) {
			bool found = false;
			for (grid.x = 0; grid.x < c_new->width; grid.x++) {
				if (square_feat(c_new, grid)->fidx == feat) {
					found = true;
					break;
				}
			}
			if (found) break;
		}

		/* Place the player */
		player_place(c_new, p, grid);
	}

	/* Apply illumination */
	cave_illuminate(c_new, is_daytime());

	/* Make some residents */
	for (i = 0; i < residents; i++) {
		pick_and_place_distant_monster(c_new, p->grid, 3, true,
			c_new->depth);
	}

	return c_new;
}